

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-async-null-cb.c
# Opt level: O2

int run_test_async_null_cb(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  async_handle.queue.prev._0_4_ = 0xffffffff;
  async_handle.queue.prev._4_4_ = 0xffffffff;
  async_handle.busy = -1;
  async_handle.pending = -1;
  async_handle.async_cb._0_4_ = 0xffffffff;
  async_handle.async_cb._4_4_ = 0xffffffff;
  async_handle.queue.next._0_4_ = 0xffffffff;
  async_handle.queue.next._4_4_ = 0xffffffff;
  async_handle.next_closing._0_4_ = 0xffffffff;
  async_handle.next_closing._4_4_ = 0xffffffff;
  async_handle.flags = 0xffffffff;
  async_handle._60_4_ = 0xffffffff;
  async_handle.handle_queue.prev._0_4_ = 0xffffffff;
  async_handle.handle_queue.next = (uv__queue *)0xffffffffffffffff;
  async_handle.handle_queue.prev._4_4_ = 0xffffffff;
  async_handle.type = ~UV_UNKNOWN_HANDLE;
  async_handle._20_4_ = 0xffffffff;
  async_handle.close_cb._0_4_ = 0xffffffff;
  async_handle.close_cb._4_4_ = 0xffffffff;
  async_handle.data._0_4_ = 0xffffffff;
  async_handle.data._4_4_ = 0xffffffff;
  async_handle.loop._0_4_ = 0xffffffff;
  async_handle.loop._4_4_ = 0xffffffff;
  uVar2 = uv_default_loop();
  iVar1 = uv_async_init(uVar2,&async_handle,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_check_init(uVar2,&check_handle);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_check_start(&check_handle,check_cb);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_thread_create(&thread,thread_cb,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          uVar2 = uv_default_loop();
          iVar1 = uv_run(uVar2,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            iVar1 = uv_thread_join(&thread);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = (int64_t)check_cb_called;
              if (eval_b == 1) {
                uVar2 = uv_default_loop();
                uv_walk(uVar2,close_walk_cb,0);
                uv_run(uVar2,0);
                eval_a = 0;
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(uv_default_loop())";
                pcVar3 = "0";
                uVar2 = 0x3e;
              }
              else {
                pcVar4 = "check_cb_called";
                pcVar3 = "1";
                uVar2 = 0x3d;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_thread_join(&thread)";
              uVar2 = 0x3c;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
            uVar2 = 0x3b;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_thread_create(&thread, thread_cb, ((void*)0))";
          uVar2 = 0x3a;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_check_start(&check_handle, check_cb)";
        uVar2 = 0x39;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_check_init(uv_default_loop(), &check_handle)";
      uVar2 = 0x38;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_async_init(uv_default_loop(), &async_handle, ((void*)0))";
    uVar2 = 0x37;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-async-null-cb.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(async_null_cb) {
  /*
   * Fill async_handle with garbage values.
   * uv_async_init() should properly initialize struct fields regardless of
   * initial values.
   * This is added to verify paddings between fields do not affect behavior.
   */
  memset(&async_handle, 0xff, sizeof(async_handle));

  ASSERT_OK(uv_async_init(uv_default_loop(), &async_handle, NULL));
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));
  ASSERT_OK(uv_thread_create(&thread, thread_cb, NULL));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_OK(uv_thread_join(&thread));
  ASSERT_EQ(1, check_cb_called);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}